

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Talk.cpp
# Opt level: O0

void limit_message(string *message,size_t chatlength)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ulong local_18;
  size_t chatlength_local;
  string *message_local;
  
  local_18 = chatlength;
  chatlength_local = (size_t)message;
  uVar1 = std::__cxx11::string::length();
  if (local_18 < uVar1) {
    std::__cxx11::string::substr((ulong)&local_58,chatlength_local);
    std::operator+(&local_38,&local_58," [...]");
    std::__cxx11::string::operator=((string *)chatlength_local,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

static void limit_message(std::string &message, std::size_t chatlength)
{
	if (message.length() > chatlength)
	{
		message = message.substr(0, chatlength - 6) + " [...]";
	}
}